

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflect.h
# Opt level: O0

void __thiscall
reflect::TypeDescriptor_Struct::dump(TypeDescriptor_Struct *this,void *obj,int indentLevel)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  reference local_40;
  Member *member;
  const_iterator __end2;
  const_iterator __begin2;
  vector<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>
  *__range2;
  int indentLevel_local;
  void *obj_local;
  TypeDescriptor_Struct *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(this->super_TypeDescriptor).name);
  poVar2 = std::operator<<(poVar2," {");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end2 = std::
           vector<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>
           ::begin(&this->members);
  member = (Member *)
           std::
           vector<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>
           ::end(&this->members);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_reflect::TypeDescriptor_Struct::Member_*,_std::vector<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>_>
                                *)&member);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<const_reflect::TypeDescriptor_Struct::Member_*,_std::vector<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>_>
               ::operator*(&__end2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,(long)(indentLevel * 4 + 4),' ',&local_61);
    poVar2 = std::operator<<((ostream *)&std::cout,local_60);
    poVar2 = std::operator<<(poVar2,local_40->name);
    std::operator<<(poVar2," = ");
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    (*local_40->type->_vptr_TypeDescriptor[3])
              (local_40->type,(long)obj + local_40->offset,(ulong)(indentLevel + 1));
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_reflect::TypeDescriptor_Struct::Member_*,_std::vector<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>_>
    ::operator++(&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,(long)(indentLevel << 2),' ',&local_99);
  poVar2 = std::operator<<((ostream *)&std::cout,local_98);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return;
}

Assistant:

virtual void dump(const void* obj, int indentLevel) const override {
        std::cout << name << " {" << std::endl;
        for (const Member& member : members) {
            std::cout << std::string(4 * (indentLevel + 1), ' ') << member.name << " = ";
            member.type->dump((char*) obj + member.offset, indentLevel + 1);
            std::cout << std::endl;
        }
        std::cout << std::string(4 * indentLevel, ' ') << "}";
    }